

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::LayerNorm_x86_avx::forward_inplace(LayerNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  long *in_RSI;
  long in_RDI;
  float *ptr_3;
  int q_1;
  float *ptr_2;
  int i_1;
  int q;
  float *ptr_1;
  int i;
  float *ptr;
  int channels;
  int h;
  int w;
  int elempack;
  int dims;
  float *in_stack_00000158;
  float *in_stack_00000160;
  float *in_stack_00000168;
  Mat *m_1;
  Mat *m;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined4 local_2d8;
  long local_2d0;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 local_2b8;
  undefined8 local_2b0;
  long local_2a8;
  int local_2a0;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined4 local_278;
  long local_270;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined8 local_250;
  long local_248;
  int local_240;
  int local_23c;
  long local_238;
  int local_22c;
  long local_228;
  int local_21c;
  int local_218;
  int local_214;
  undefined4 local_210;
  int local_20c;
  long *local_200;
  undefined8 *local_1f0;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  int local_19c;
  undefined8 *local_198;
  int local_18c;
  long *local_188;
  undefined1 local_17d;
  int local_17c;
  undefined8 *local_170;
  undefined1 local_165;
  int local_164;
  undefined8 *local_158;
  undefined8 *local_140;
  undefined8 *local_130;
  long local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  long local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_78;
  undefined8 *local_58;
  
  local_20c = (int)in_RSI[5];
  local_210 = (undefined4)in_RSI[3];
  local_214 = *(int *)((long)in_RSI + 0x2c);
  local_218 = (int)in_RSI[6];
  local_21c = (int)in_RSI[7];
  local_200 = in_RSI;
  if (local_20c == 1) {
    local_228 = *in_RSI;
    local_1a8 = in_RDI + 0xe0;
    local_1b0 = in_RDI + 0x128;
    layernorm(in_stack_00000168,in_stack_00000160,in_stack_00000158,this._4_4_,(int)this,
              bottom_top_blob._4_4_);
  }
  if (local_20c == 2) {
    for (local_22c = 0; local_22c < local_218; local_22c = local_22c + 1) {
      local_188 = local_200;
      local_18c = local_22c;
      local_238 = *local_200 +
                  (long)*(int *)((long)local_200 + 0x2c) * (long)local_22c * local_200[2];
      local_1b8 = in_RDI + 0xe0;
      local_1c0 = in_RDI + 0x128;
      layernorm(in_stack_00000168,in_stack_00000160,in_stack_00000158,this._4_4_,(int)this,
                bottom_top_blob._4_4_);
    }
  }
  if (local_20c == 3) {
    if (*(int *)(in_RDI + 0xd0) == local_214) {
      for (local_23c = 0; local_23c < local_21c; local_23c = local_23c + 1) {
        for (local_240 = 0; local_240 < local_218; local_240 = local_240 + 1) {
          local_158 = &local_290;
          local_f4 = *(int *)((long)local_200 + 0x2c);
          local_f8 = (int)local_200[6];
          local_fc = *(undefined4 *)((long)local_200 + 0x34);
          local_108 = *local_200 + local_200[8] * (long)local_23c * local_200[2];
          local_110 = local_200[2];
          local_114 = (undefined4)local_200[3];
          local_120 = local_200[4];
          local_f0 = &local_290;
          local_98 = (long)local_f4 * (long)local_f8 * local_110;
          local_198 = &local_290;
          local_248 = local_108 + (long)local_f4 * (long)local_240 * local_110;
          local_140 = &local_290;
          local_9c = 0x10;
          local_164 = local_23c;
          local_165 = 1;
          local_19c = local_240;
          local_290 = 0;
          local_280 = 0;
          local_278 = 0;
          local_268 = 0;
          local_264 = 0;
          local_260 = 0;
          local_25c = 0;
          local_258 = 0;
          local_250 = 0;
          local_288 = 0;
          local_1c8 = in_RDI + 0xe0;
          local_1d0 = in_RDI + 0x128;
          local_58 = local_140;
          local_270 = local_120;
          layernorm(in_stack_00000168,in_stack_00000160,in_stack_00000158,this._4_4_,(int)this,
                    bottom_top_blob._4_4_);
        }
      }
    }
    else {
      for (local_2a0 = 0; local_2a0 < local_21c; local_2a0 = local_2a0 + 1) {
        local_170 = &local_2f0;
        local_bc = *(int *)((long)local_200 + 0x2c);
        local_c0 = (int)local_200[6];
        local_c4 = *(undefined4 *)((long)local_200 + 0x34);
        local_2a8 = *local_200 + local_200[8] * (long)local_2a0 * local_200[2];
        local_d8 = local_200[2];
        local_dc = (undefined4)local_200[3];
        local_e8 = local_200[4];
        local_b8 = &local_2f0;
        local_a8 = (long)local_bc * (long)local_c0 * local_d8;
        local_1f0 = &local_2f0;
        local_130 = &local_2f0;
        local_ac = 0x10;
        local_17c = local_2a0;
        local_17d = 1;
        local_2f0 = 0;
        local_2e0 = 0;
        local_2d8 = 0;
        local_2c8 = 0;
        local_2c4 = 0;
        local_2c0 = 0;
        local_2bc = 0;
        local_2b8 = 0;
        local_2b0 = 0;
        local_2e8 = 0;
        local_1d8 = in_RDI + 0xe0;
        local_1e0 = in_RDI + 0x128;
        local_d0 = local_2a8;
        local_78 = local_130;
        local_2d0 = local_e8;
        layernorm(in_stack_00000168,in_stack_00000160,in_stack_00000158,this._4_4_,(int)this,
                  bottom_top_blob._4_4_);
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int elempack = bottom_top_blob.elempack;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int channels = bottom_top_blob.c;

    if (dims == 1)
    {
        // assert affine_size == w

        float* ptr = bottom_top_blob;
        layernorm(ptr, gamma_data, beta_data, eps, w * elempack, 1);
    }

    if (dims == 2)
    {
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            layernorm(ptr, gamma_data, beta_data, eps, w, elempack);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    layernorm(ptr, gamma_data, beta_data, eps, w, elempack);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                layernorm(ptr, gamma_data, beta_data, eps, w * h, elempack);
            }
        }
    }

    return 0;
}